

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

bool __thiscall
helics::CommonCore::getFlagOption(CommonCore *this,LocalFederateId federateID,int32_t flag)

{
  FederateState *this_00;
  InvalidIdentifier *this_01;
  bool bVar1;
  string_view message;
  
  if (flag < 0x2d) {
    if (flag < 0x1b) {
      if (flag == 0xc) {
        return false;
      }
      if (flag == 0xe) {
        return false;
      }
    }
    else {
      if (flag == 0x1b) {
        return false;
      }
      if (flag == 0x1f) goto LAB_002b24ce;
    }
  }
  else {
    if (flag - 0x58U < 2) {
LAB_002b24ce:
      bVar1 = BrokerBase::getFlagValue(&this->super_BrokerBase,flag);
      return bVar1;
    }
    if (flag == 0x2d) {
      bVar1 = (this->delayInitCounter).super___atomic_base<short>._M_i == 0;
      goto LAB_002b24e4;
    }
    if (flag == 0x2f) {
      return (this->delayInitCounter).super___atomic_base<short>._M_i == 0;
    }
  }
  if (federateID.fid != -0x103) {
    this_00 = getFederateAt(this,federateID);
    if (this_00 != (FederateState *)0x0) {
      bVar1 = FederateState::getOptionFlag(this_00,flag);
      return bVar1;
    }
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    message._M_str = "federateID not valid (setTimeDelta)";
    message._M_len = 0x23;
    InvalidIdentifier::InvalidIdentifier(this_01,message);
    __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
  }
  if (flag != 0x114) {
    return false;
  }
  bVar1 = (((this->super_BrokerBase).mLogManager.
            super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mLogBuffer).
          mMaxSize.super___atomic_base<unsigned_long>._M_i == 0;
LAB_002b24e4:
  return !bVar1;
}

Assistant:

bool CommonCore::getFlagOption(LocalFederateId federateID, int32_t flag) const
{
    switch (flag) {
        case defs::Flags::ENABLE_INIT_ENTRY:
            return (delayInitCounter.load() == 0);
        case defs::Flags::DELAY_INIT_ENTRY:
            return (delayInitCounter.load() != 0);
        case defs::Flags::DUMPLOG:
        case defs::Flags::FORCE_LOGGING_FLUSH:
        case defs::Flags::DEBUGGING:
            return getFlagValue(flag);
        case defs::Flags::FORWARD_COMPUTE:
        case defs::Flags::SINGLE_THREAD_FEDERATE:
        case defs::Flags::ROLLBACK:
            return false;
        default:
            break;
    }
    if (federateID == gLocalCoreId) {
        if (flag == defs::Properties::LOG_BUFFER) {
            return (mLogManager->getLogBuffer().capacity() > 0);
        }
        return false;
    }
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid (setTimeDelta)"));
    }
    return fed->getOptionFlag(flag);
}